

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O3

void __thiscall
Test_aistr_checkPointerNotNull_Test::TestBody(Test_aistr_checkPointerNotNull_Test *this)

{
  bool bVar1;
  char buf [10];
  AssertHelper local_28;
  AssertHelper local_20;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18 [2];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::checkPointerNotNull((char *)0x0);
  }
  testing::Message::Message((Message *)local_18);
  testing::internal::AssertHelper::AssertHelper
            (&local_28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x19,
             "Expected: ai::checkPointerNotNull(nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_28,(Message *)local_18);
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  if (local_18[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_18[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_18[0].ptr_ + 8))();
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::checkPointerNotNull((char *)0x0);
  }
  testing::Message::Message((Message *)&local_28);
  testing::internal::AssertHelper::AssertHelper
            (&local_20,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x1c,
             "Expected: ai::checkPointerNotNull(ptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  if (local_28.data_ != (AssertHelperData *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_28.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_28.data_ + 8))();
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ai::checkPointerNotNull((char *)local_18);
    }
  }
  else {
    testing::Message::Message((Message *)&local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x1e,
               "Expected: ai::checkPointerNotNull(ptr) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_28.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_28.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_28.data_ + 8))();
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, checkPointerNotNull) {
    EXPECT_THROW(ai::checkPointerNotNull(nullptr), std::invalid_argument);
    char buf[10];
    char* ptr = nullptr;
    EXPECT_THROW(ai::checkPointerNotNull(ptr), std::invalid_argument);
    ptr = &buf[0];
    EXPECT_NO_THROW(ai::checkPointerNotNull(ptr));
}